

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.hpp
# Opt level: O0

ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>
* __thiscall
chains::module<chains::gain::Module,chains::Expose<>,chains::Value<chains::gain::Gain>>
          (ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>
           *__return_storage_ptr__,chains *this,char *moduleName,Value<chains::gain::Gain> *values)

{
  tuple<chains::Parameter<chains::gain::Gain>_> local_48;
  char *local_38;
  undefined1 local_29 [9];
  tuple<chains::Parameter<chains::gain::Gain>_> parameters;
  Value<chains::gain::Gain> *values_local;
  char *moduleName_local;
  
  parameters.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
  super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.moduleName_ =
       moduleName;
  std::tuple<chains::gain::Gain>::tuple<void,_true>((tuple<chains::gain::Gain> *)local_29);
  local_38 = parameters.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
             super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.
             moduleName_;
  boost::hana::transform_t::operator()
            ((transform_t *)(local_29 + 1),(tuple<chains::gain::Gain> *)&boost::hana::transform,
             (anon_class_8_1_70098e60 *)local_29);
  local_48.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
  super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.defaultValue_ =
       (double)local_29._1_8_;
  local_48.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
  super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.moduleName_ =
       (char *)parameters.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
               super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.
               defaultValue_;
  ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>
  ::ModuleHost(__return_storage_ptr__,(char *)this,&local_48);
  return __return_storage_ptr__;
}

Assistant:

auto module(const char* moduleName, const Values&... values)
{
  // Get the module's parameters, if specified
  using ModuleParameters = typename detail::ModuleParameters<ModuleTraits>::type;

  static_assert(valueParameterCheck<ModuleParameters, Values...>,
                "Value for parameter not found in module's parameter list");

  // Make a list of parameters from the module's parameter traits, applying any
  // user-specified values
  auto parameters =
    boost::hana::transform(ModuleParameters{}, [&values...](const auto& parameterTraits) {
      return detail::makeParameter(parameterTraits, values...);
    });

  return ModuleHost<ModuleTraits, decltype(parameters), Exposed>{moduleName, parameters};
}